

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_severity.h
# Opt level: O0

char * absl::LogSeverityName(LogSeverity s)

{
  char *pcStack_10;
  LogSeverity s_local;
  
  switch(s) {
  case kInfo:
    pcStack_10 = "INFO";
    break;
  case kWarning:
    pcStack_10 = "WARNING";
    break;
  case kError:
    pcStack_10 = "ERROR";
    break;
  case kFatal:
    pcStack_10 = "FATAL";
    break;
  default:
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

constexpr const char* LogSeverityName(absl::LogSeverity s) {
  switch (s) {
    case absl::LogSeverity::kInfo: return "INFO";
    case absl::LogSeverity::kWarning: return "WARNING";
    case absl::LogSeverity::kError: return "ERROR";
    case absl::LogSeverity::kFatal: return "FATAL";
  }
  return "UNKNOWN";
}